

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

SASL_MECHANISMS_HANDLE sasl_mechanisms_clone(SASL_MECHANISMS_HANDLE value)

{
  AMQP_VALUE pAVar1;
  SASL_MECHANISMS_HANDLE local_18;
  SASL_MECHANISMS_INSTANCE *sasl_mechanisms_instance;
  SASL_MECHANISMS_HANDLE value_local;
  
  local_18 = (SASL_MECHANISMS_HANDLE)malloc(8);
  if (local_18 != (SASL_MECHANISMS_HANDLE)0x0) {
    pAVar1 = amqpvalue_clone(value->composite_value);
    local_18->composite_value = pAVar1;
    if (local_18->composite_value == (AMQP_VALUE)0x0) {
      free(local_18);
      local_18 = (SASL_MECHANISMS_HANDLE)0x0;
    }
  }
  return local_18;
}

Assistant:

SASL_MECHANISMS_HANDLE sasl_mechanisms_clone(SASL_MECHANISMS_HANDLE value)
{
    SASL_MECHANISMS_INSTANCE* sasl_mechanisms_instance = (SASL_MECHANISMS_INSTANCE*)malloc(sizeof(SASL_MECHANISMS_INSTANCE));
    if (sasl_mechanisms_instance != NULL)
    {
        sasl_mechanisms_instance->composite_value = amqpvalue_clone(((SASL_MECHANISMS_INSTANCE*)value)->composite_value);
        if (sasl_mechanisms_instance->composite_value == NULL)
        {
            free(sasl_mechanisms_instance);
            sasl_mechanisms_instance = NULL;
        }
    }

    return sasl_mechanisms_instance;
}